

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool AdjustPolyCurve(ON_PolyCurve *crv,ON_3dPoint *P0,ON_3dPoint *P1)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ON_Curve *pOVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  ON_3dPointArray Points;
  byte local_64;
  ON_SimpleArray<ON_3dPoint> local_60;
  ON_3dPoint local_48;
  
  iVar4 = ON_PolyCurve::Count(crv);
  if (iVar4 == 1) {
    local_64 = 0;
    pOVar6 = ON_PolyCurve::SegmentCurve(crv,0);
    if (pOVar6 != (ON_Curve *)0x0) {
      bVar2 = AdjustCurve(pOVar6,P0,P1);
      return bVar2;
    }
  }
  else {
    iVar4 = ON_PolyCurve::Count(crv);
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_60,iVar4 + 1);
    ON_Curve::PointAtStart(&local_48,&crv->super_ON_Curve);
    ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
    for (iVar4 = 0; iVar5 = ON_PolyCurve::Count(crv), iVar4 < iVar5; iVar4 = iVar4 + 1) {
      pOVar6 = ON_PolyCurve::SegmentCurve(crv,iVar4);
      ON_Curve::PointAtEnd(&local_48,pOVar6);
      ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
    }
    bVar2 = AdjustPointListAlongChord((ON_3dPointArray *)&local_60,P0,P1);
    if (bVar2) {
      lVar9 = 0x18;
      lVar8 = 0;
      bVar7 = false;
      do {
        local_64 = bVar7;
        iVar4 = ON_PolyCurve::Count(crv);
        if (iVar4 <= lVar8) break;
        pOVar6 = ON_PolyCurve::SegmentCurve(crv,(int)lVar8);
        bVar7 = (bool)local_64;
        if (pOVar6 != (ON_Curve *)0x0) {
          bVar3 = AdjustCurve(pOVar6,(ON_3dPoint *)((long)&local_60.m_a[-1].x + lVar9),
                              (ON_3dPoint *)((long)&(local_60.m_a)->x + lVar9));
          ON_Curve::PointAtEnd(&local_48,pOVar6);
          if (bVar3) {
            bVar7 = true;
          }
          *(double *)((long)&(local_60.m_a)->z + lVar9) = local_48.z;
          pdVar1 = (double *)((long)&(local_60.m_a)->x + lVar9);
          *pdVar1 = local_48.x;
          pdVar1[1] = local_48.y;
          local_64 = bVar2;
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0x18;
        bVar2 = (bool)local_64;
      } while (pOVar6 != (ON_Curve *)0x0);
    }
    else {
      iVar4 = (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])(crv);
      local_64 = 1;
      if ((char)iVar4 == '\0') {
        iVar4 = (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])
                          (crv);
        local_64 = (byte)iVar4;
      }
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_60);
  }
  return (bool)(local_64 & 1);
}

Assistant:

static bool AdjustPolyCurve(ON_PolyCurve& crv,
                             const ON_3dPoint& P0, 
                             const ON_3dPoint& P1)

{
  if (crv.Count() == 1){
    ON_Curve* pSeg = crv.SegmentCurve(0);
    if (!pSeg)
      return false;
    return AdjustCurve(*pSeg, P0, P1);
  }

  ON_3dPointArray Points(crv.Count() + 1);
  Points.Append(crv.PointAtStart());

  int i;
  for (i=0; i<crv.Count(); i++)
    Points.Append(crv.SegmentCurve(i)->PointAtEnd());

  if (!AdjustPointListAlongChord(Points, P0, P1)){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  bool rc = false;
  for (i=0; i<crv.Count(); i++){
    ON_Curve* pSeg = crv.SegmentCurve(i);
    if (!pSeg)
      return rc;
    if (AdjustCurve(*pSeg, Points[i], Points[i+1]))
      rc = true;
    Points[i+1] = pSeg->PointAtEnd();
  }

  return rc;
}